

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

void __thiscall
pbrt::BinaryWriter::write<pbrt::math::vec2f,std::allocator<pbrt::math::vec2f>,void>
          (BinaryWriter *this,vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *t)

{
  pointer ptr;
  pointer pvVar1;
  long local_18;
  
  local_18 = (long)(t->super__Vector_base<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(t->super__Vector_base<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3;
  writeRaw(this,&local_18,8);
  ptr = (t->super__Vector_base<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>)._M_impl.
        super__Vector_impl_data._M_start;
  pvVar1 = (t->super__Vector_base<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (ptr != pvVar1) {
    writeRaw(this,ptr,(long)pvVar1 - (long)ptr);
  }
  return;
}

Assistant:

void write(const std::vector<T, A> &t)
    {
      size_t size = t.size();
      write((uint64_t)size);
      if (!t.empty())
        writeRaw(t.data(),t.size()*sizeof(T));
    }